

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FrameManager.cpp
# Opt level: O0

void __thiscall
myvk::FrameManager::initialize
          (FrameManager *this,Ptr<Queue> *graphics_queue,Ptr<PresentQueue> *present_queue,
          bool use_vsync,uint32_t frame_count,VkImageUsageFlags image_usage)

{
  uint32_t uVar1;
  element_type *peVar2;
  byte in_CL;
  Ptr<Swapchain> *in_RDI;
  uint in_R8D;
  uint32_t i_1;
  uint32_t i;
  VkImageUsageFlags in_stack_00000188;
  bool in_stack_0000018f;
  Ptr<PresentQueue> *in_stack_00000190;
  Ptr<Queue> *in_stack_00000198;
  shared_ptr<myvk::ImageView> *in_stack_fffffffffffffed8;
  shared_ptr<myvk::CommandBuffer> *__r;
  shared_ptr<myvk::CommandBuffer> *in_stack_fffffffffffffee0;
  vector<std::shared_ptr<myvk::SwapchainImage>,_std::allocator<std::shared_ptr<myvk::SwapchainImage>_>_>
  *in_stack_fffffffffffffee8;
  vector<std::shared_ptr<myvk::SwapchainImage>,_std::allocator<std::shared_ptr<myvk::SwapchainImage>_>_>
  *in_stack_fffffffffffffef0;
  size_type in_stack_fffffffffffffef8;
  undefined4 in_stack_ffffffffffffff00;
  undefined4 in_stack_ffffffffffffff04;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *__new_size;
  undefined4 in_stack_ffffffffffffff10;
  uint uVar3;
  Ptr<Device> *in_stack_ffffffffffffff48;
  VkFenceCreateFlags in_stack_ffffffffffffff54;
  Ptr<Device> *in_stack_ffffffffffffff58;
  VkCommandBufferLevel in_stack_ffffffffffffff64;
  element_type *in_stack_ffffffffffffff68;
  shared_ptr<myvk::CommandBuffer> local_88;
  uint local_74;
  undefined8 local_70;
  uint local_54;
  uint local_20;
  byte local_19;
  Ptr<Swapchain> *swapchain;
  
  local_19 = in_CL & 1;
  local_20 = in_R8D;
  swapchain = in_RDI;
  Swapchain::Create(in_stack_00000198,in_stack_00000190,in_stack_0000018f,in_stack_00000188);
  std::shared_ptr<myvk::Swapchain>::operator=
            ((shared_ptr<myvk::Swapchain> *)in_stack_fffffffffffffee0,
             (shared_ptr<myvk::Swapchain> *)in_stack_fffffffffffffed8);
  std::shared_ptr<myvk::Swapchain>::~shared_ptr((shared_ptr<myvk::Swapchain> *)0x297feb);
  SwapchainImage::Create(swapchain);
  std::
  vector<std::shared_ptr<myvk::SwapchainImage>,_std::allocator<std::shared_ptr<myvk::SwapchainImage>_>_>
  ::operator=(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
  std::
  vector<std::shared_ptr<myvk::SwapchainImage>,_std::allocator<std::shared_ptr<myvk::SwapchainImage>_>_>
  ::~vector(in_stack_fffffffffffffef0);
  peVar2 = std::__shared_ptr_access<myvk::Swapchain,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<myvk::Swapchain,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x29803e);
  Swapchain::GetImageCount(peVar2);
  std::vector<std::shared_ptr<myvk::ImageView>,_std::allocator<std::shared_ptr<myvk::ImageView>_>_>
  ::resize((vector<std::shared_ptr<myvk::ImageView>,_std::allocator<std::shared_ptr<myvk::ImageView>_>_>
            *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
           in_stack_fffffffffffffef8);
  local_54 = 0;
  while( true ) {
    uVar3 = local_54;
    peVar2 = std::__shared_ptr_access<myvk::Swapchain,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<myvk::Swapchain,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x298078);
    uVar1 = Swapchain::GetImageCount(peVar2);
    if (uVar1 <= uVar3) break;
    std::
    vector<std::shared_ptr<myvk::SwapchainImage>,_std::allocator<std::shared_ptr<myvk::SwapchainImage>_>_>
    ::operator[]((vector<std::shared_ptr<myvk::SwapchainImage>,_std::allocator<std::shared_ptr<myvk::SwapchainImage>_>_>
                  *)&in_RDI[5].super___shared_ptr<myvk::Swapchain,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount,(ulong)local_54);
    ImageView::Create((Ptr<SwapchainImage> *)in_stack_ffffffffffffff48);
    std::
    vector<std::shared_ptr<myvk::ImageView>,_std::allocator<std::shared_ptr<myvk::ImageView>_>_>::
    operator[]((vector<std::shared_ptr<myvk::ImageView>,_std::allocator<std::shared_ptr<myvk::ImageView>_>_>
                *)(in_RDI + 7),(ulong)local_54);
    std::shared_ptr<myvk::ImageView>::operator=
              ((shared_ptr<myvk::ImageView> *)in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
    std::shared_ptr<myvk::ImageView>::~shared_ptr((shared_ptr<myvk::ImageView> *)0x2980e5);
    local_54 = local_54 + 1;
  }
  *(uint *)((long)&in_RDI[2].super___shared_ptr<myvk::Swapchain,_(__gnu_cxx::_Lock_policy)2>._M_ptr
           + 4) = local_20;
  __new_size = &in_RDI[8].super___shared_ptr<myvk::Swapchain,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount;
  peVar2 = std::__shared_ptr_access<myvk::Swapchain,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<myvk::Swapchain,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x298121);
  Swapchain::GetImageCount(peVar2);
  local_70 = 0;
  std::vector<const_myvk::Fence_*,_std::allocator<const_myvk::Fence_*>_>::resize
            ((vector<const_myvk::Fence_*,_std::allocator<const_myvk::Fence_*>_> *)
             CONCAT44(uVar3,in_stack_ffffffffffffff10),(size_type)__new_size,
             (value_type *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00));
  std::vector<std::shared_ptr<myvk::Fence>,_std::allocator<std::shared_ptr<myvk::Fence>_>_>::resize
            ((vector<std::shared_ptr<myvk::Fence>,_std::allocator<std::shared_ptr<myvk::Fence>_>_> *
             )CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
             in_stack_fffffffffffffef8);
  std::vector<std::shared_ptr<myvk::Semaphore>,_std::allocator<std::shared_ptr<myvk::Semaphore>_>_>
  ::resize((vector<std::shared_ptr<myvk::Semaphore>,_std::allocator<std::shared_ptr<myvk::Semaphore>_>_>
            *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
           in_stack_fffffffffffffef8);
  std::vector<std::shared_ptr<myvk::Semaphore>,_std::allocator<std::shared_ptr<myvk::Semaphore>_>_>
  ::resize((vector<std::shared_ptr<myvk::Semaphore>,_std::allocator<std::shared_ptr<myvk::Semaphore>_>_>
            *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
           in_stack_fffffffffffffef8);
  std::
  vector<std::shared_ptr<myvk::CommandBuffer>,_std::allocator<std::shared_ptr<myvk::CommandBuffer>_>_>
  ::resize((vector<std::shared_ptr<myvk::CommandBuffer>,_std::allocator<std::shared_ptr<myvk::CommandBuffer>_>_>
            *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
           in_stack_fffffffffffffef8);
  for (local_74 = 0; local_74 < local_20; local_74 = local_74 + 1) {
    peVar2 = std::__shared_ptr_access<myvk::Swapchain,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<myvk::Swapchain,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x2981e5);
    (*(peVar2->super_DeviceObjectBase).super_Base._vptr_Base[2])();
    __r = &local_88;
    Fence::Create(in_stack_ffffffffffffff58,in_stack_ffffffffffffff54);
    std::vector<std::shared_ptr<myvk::Fence>,_std::allocator<std::shared_ptr<myvk::Fence>_>_>::
    operator[]((vector<std::shared_ptr<myvk::Fence>,_std::allocator<std::shared_ptr<myvk::Fence>_>_>
                *)(in_RDI + 10),(ulong)local_74);
    std::shared_ptr<myvk::Fence>::operator=
              ((shared_ptr<myvk::Fence> *)in_stack_fffffffffffffee0,(shared_ptr<myvk::Fence> *)__r);
    std::shared_ptr<myvk::Fence>::~shared_ptr((shared_ptr<myvk::Fence> *)0x298239);
    peVar2 = std::__shared_ptr_access<myvk::Swapchain,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<myvk::Swapchain,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x298243);
    (*(peVar2->super_DeviceObjectBase).super_Base._vptr_Base[2])();
    in_stack_fffffffffffffee0 = (shared_ptr<myvk::CommandBuffer> *)&stack0xffffffffffffff68;
    Semaphore::Create(in_stack_ffffffffffffff48);
    std::
    vector<std::shared_ptr<myvk::Semaphore>,_std::allocator<std::shared_ptr<myvk::Semaphore>_>_>::
    operator[]((vector<std::shared_ptr<myvk::Semaphore>,_std::allocator<std::shared_ptr<myvk::Semaphore>_>_>
                *)&in_RDI[0xb].super___shared_ptr<myvk::Swapchain,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount,(ulong)local_74);
    std::shared_ptr<myvk::Semaphore>::operator=
              ((shared_ptr<myvk::Semaphore> *)in_stack_fffffffffffffee0,
               (shared_ptr<myvk::Semaphore> *)__r);
    std::shared_ptr<myvk::Semaphore>::~shared_ptr((shared_ptr<myvk::Semaphore> *)0x298295);
    peVar2 = std::__shared_ptr_access<myvk::Swapchain,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<myvk::Swapchain,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x29829f);
    (*(peVar2->super_DeviceObjectBase).super_Base._vptr_Base[2])();
    Semaphore::Create(in_stack_ffffffffffffff48);
    std::
    vector<std::shared_ptr<myvk::Semaphore>,_std::allocator<std::shared_ptr<myvk::Semaphore>_>_>::
    operator[]((vector<std::shared_ptr<myvk::Semaphore>,_std::allocator<std::shared_ptr<myvk::Semaphore>_>_>
                *)(in_RDI + 0xd),(ulong)local_74);
    std::shared_ptr<myvk::Semaphore>::operator=
              ((shared_ptr<myvk::Semaphore> *)in_stack_fffffffffffffee0,
               (shared_ptr<myvk::Semaphore> *)__r);
    std::shared_ptr<myvk::Semaphore>::~shared_ptr((shared_ptr<myvk::Semaphore> *)0x2982f1);
    CommandPool::Create((Ptr<Queue> *)in_stack_ffffffffffffff68,in_stack_ffffffffffffff64);
    CommandBuffer::Create((Ptr<CommandPool> *)in_stack_ffffffffffffff68,in_stack_ffffffffffffff64);
    std::
    vector<std::shared_ptr<myvk::CommandBuffer>,_std::allocator<std::shared_ptr<myvk::CommandBuffer>_>_>
    ::operator[]((vector<std::shared_ptr<myvk::CommandBuffer>,_std::allocator<std::shared_ptr<myvk::CommandBuffer>_>_>
                  *)&in_RDI[0xe].super___shared_ptr<myvk::Swapchain,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount,(ulong)local_74);
    std::shared_ptr<myvk::CommandBuffer>::operator=(in_stack_fffffffffffffee0,__r);
    std::shared_ptr<myvk::CommandBuffer>::~shared_ptr((shared_ptr<myvk::CommandBuffer> *)0x298354);
    std::shared_ptr<myvk::CommandPool>::~shared_ptr((shared_ptr<myvk::CommandPool> *)0x29835e);
  }
  return;
}

Assistant:

void FrameManager::initialize(const Ptr<Queue> &graphics_queue, const Ptr<PresentQueue> &present_queue, bool use_vsync,
                              uint32_t frame_count, VkImageUsageFlags image_usage) {
	m_swapchain = myvk::Swapchain::Create(graphics_queue, present_queue, use_vsync, image_usage);
	m_swapchain_images = myvk::SwapchainImage::Create(m_swapchain);
	m_swapchain_image_views.resize(m_swapchain->GetImageCount());
	for (uint32_t i = 0; i < m_swapchain->GetImageCount(); ++i)
		m_swapchain_image_views[i] = myvk::ImageView::Create(m_swapchain_images[i]);

	m_frame_count = frame_count;
	m_image_fences.resize(m_swapchain->GetImageCount(), nullptr);

	m_frame_fences.resize(frame_count);
	m_render_done_semaphores.resize(frame_count);
	m_acquire_done_semaphores.resize(frame_count);
	m_frame_command_buffers.resize(frame_count);

	for (uint32_t i = 0; i < frame_count; ++i) {
		m_frame_fences[i] = Fence::Create(m_swapchain->GetDevicePtr(), VK_FENCE_CREATE_SIGNALED_BIT);
		m_render_done_semaphores[i] = Semaphore::Create(m_swapchain->GetDevicePtr());
		m_acquire_done_semaphores[i] = Semaphore::Create(m_swapchain->GetDevicePtr());
		m_frame_command_buffers[i] = myvk::CommandBuffer::Create(myvk::CommandPool::Create(graphics_queue));
	}
}